

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O3

optional<VariableDefinition> * __thiscall
Scope::find(optional<VariableDefinition> *__return_storage_ptr__,Scope *this,string *variableName,
           bool canCrossFunctionBarrier)

{
  Scope *this_00;
  byte bVar1;
  _Storage<VariableDefinition,_false> local_58;
  char local_40;
  optional<VariableDefinition> *local_38;
  
  local_38 = __return_storage_ptr__;
  findLocally((optional<VariableDefinition> *)&local_58._M_value,this,variableName,false);
  if (local_40 == '\0') {
    bVar1 = 0;
    do {
      this_00 = (this->outerScope).super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((this_00 == (Scope *)0x0) ||
         ((!canCrossFunctionBarrier && (this->outerScopeCrossesFunctionBarrier != false)))) {
        (local_38->super__Optional_base<VariableDefinition,_false,_false>)._M_payload.
        super__Optional_payload<VariableDefinition,_true,_false,_false>.
        super__Optional_payload_base<VariableDefinition>._M_engaged = false;
        return local_38;
      }
      bVar1 = bVar1 | this->outerScopeCrossesFunctionBarrier & canCrossFunctionBarrier;
      findLocally((optional<VariableDefinition> *)&local_58._M_value,this_00,variableName,
                  (bool)(bVar1 & 1));
      this = this_00;
    } while (local_40 == '\0');
  }
  (local_38->super__Optional_base<VariableDefinition,_false,_false>)._M_payload.
  super__Optional_payload<VariableDefinition,_true,_false,_false>.
  super__Optional_payload_base<VariableDefinition>._M_payload._M_value.token.
  super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_58._M_value.token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(local_38->super__Optional_base<VariableDefinition,_false,_false>)._M_payload.
          super__Optional_payload<VariableDefinition,_true,_false,_false>.
          super__Optional_payload_base<VariableDefinition>._M_payload._M_value.token.
          super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_58._M_value.token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  (local_38->super__Optional_base<VariableDefinition,_false,_false>)._M_payload.
  super__Optional_payload<VariableDefinition,_true,_false,_false>.
  super__Optional_payload_base<VariableDefinition>._M_payload._M_value.isFullyBound =
       local_58._M_value.isFullyBound;
  (local_38->super__Optional_base<VariableDefinition,_false,_false>)._M_payload.
  super__Optional_payload<VariableDefinition,_true,_false,_false>.
  super__Optional_payload_base<VariableDefinition>._M_engaged = true;
  return local_38;
}

Assistant:

std::optional<VariableDefinition> find(const std::string & variableName, bool canCrossFunctionBarrier) {

    Scope* scopeToSearch = this;

    bool considerPartiallyBound = false;

    while (true) {
      auto find = scopeToSearch->findLocally(variableName, considerPartiallyBound);

      if (find) {
        return find;
      }

      if (scopeToSearch->outerScope != nullptr) {
        if (scopeToSearch->outerScopeCrossesFunctionBarrier) {
          considerPartiallyBound = true;
        }

        if (!canCrossFunctionBarrier && scopeToSearch->outerScopeCrossesFunctionBarrier) {
          return std::nullopt;

        } else {
          scopeToSearch = scopeToSearch->outerScope.get();
        }
      } else {
        return std::nullopt;
      }
    }
  }